

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward.c
# Opt level: O1

int32 forward(float64 **active_alpha,uint32 **active_astate,uint32 *n_active_astate,uint32 **bp,
             float64 *scale,float64 **dscale,vector_t **feature,uint32 n_obs,state_t *state_seq,
             uint32 n_state,model_inventory_t *inv,float64 beam,s3phseg_t *phseg,bw_timers_t *timers
             ,uint32 mmi_train)

{
  uint32 uVar1;
  double *pdVar2;
  undefined8 *puVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  gauden_t *g;
  acmod_set_t *acmod_set;
  float32 ***pppfVar9;
  float32 *pfVar10;
  uint32 *puVar11;
  float64 fVar12;
  double dVar13;
  double dVar14;
  acmod_id_t aVar15;
  acmod_id_t aVar16;
  void *ptr;
  float64 ***den;
  uint32 ***den_idx;
  double *ptr_00;
  undefined4 *ptr_01;
  void *ptr_02;
  uint32 *cb;
  void *__s;
  float64 *pfVar17;
  uint32 *puVar18;
  size_t sVar19;
  uint32 *puVar20;
  ulong uVar21;
  int32 iVar22;
  uint uVar23;
  uint uVar24;
  uint32 uVar25;
  size_t n_elem;
  uint uVar26;
  uint32 **prev_den_idx;
  ulong uVar27;
  size_t sVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  double dVar35;
  void *local_100;
  s3phseg_t *local_e8;
  
  uVar29 = (ulong)n_state;
  uVar5 = inv->n_cb_inverse;
  uVar27 = (ulong)uVar5;
  ptr = __ckd_calloc__(uVar27,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                       ,0xe8);
  g = inv->gauden;
  acmod_set = inv->mdef->acmod_set;
  den = (float64 ***)
        __ckd_calloc_3d__(uVar27,(ulong)g->n_feat,(ulong)g->n_top,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                          ,0xee);
  den_idx = (uint32 ***)
            __ckd_calloc_3d__(uVar27,(ulong)g->n_feat,(ulong)g->n_top,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                              ,0xf0);
  pppfVar9 = inv->mixw;
  ptr_00 = (double *)
           __ckd_calloc__(uVar29,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                          ,0xf5);
  ptr_01 = (undefined4 *)
           __ckd_calloc__(uVar29,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                          ,0xf8);
  ptr_02 = __ckd_calloc__(uVar29,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                          ,0xf9);
  cb = (uint32 *)
       __ckd_calloc__(uVar29,4,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                      ,0xfc);
  __s = __ckd_calloc__(uVar29,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                       ,0x100);
  if (uVar29 != 0) {
    memset(__s,0xff,uVar29 * 2);
  }
  if (timers != (bw_timers_t *)0x0) {
    ptmr_start(&timers->gau_timer);
  }
  gauden_compute_log(den[state_seq->l_cb],den_idx[state_seq->l_cb],*feature,g,state_seq->cb,
                     (uint32 **)0x0);
  *cb = state_seq->l_cb;
  pfVar17 = gauden_scale_densities_fwd(den,den_idx,cb,1,g);
  *dscale = pfVar17;
  fVar12 = gauden_mixture(den[state_seq->l_cb],den_idx[state_seq->l_cb],pppfVar9[state_seq->mixw],g)
  ;
  *ptr_00 = (double)fVar12;
  if (timers != (bw_timers_t *)0x0) {
    ptmr_stop(&timers->gau_timer);
  }
  if (*ptr_00 <= 1.199999978106707e-38) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
            ,300,"Small output prob (== %.2e) seen at frame 0 state 0\n");
    iVar22 = -1;
    local_100 = (void *)0x0;
  }
  else {
    pfVar17 = (float64 *)
              __ckd_calloc__(1,8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                             ,0x137);
    *active_alpha = pfVar17;
    puVar18 = (uint32 *)
              __ckd_calloc__(1,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                             ,0x138);
    *active_astate = puVar18;
    if (bp == (uint32 **)0x0) {
      local_100 = (void *)0x0;
    }
    else {
      puVar18 = (uint32 *)
                __ckd_calloc__(1,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                               ,0x13a);
      *bp = puVar18;
      local_100 = __ckd_calloc__(1,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                 ,0x141);
    }
    uVar26 = 0;
    *scale = (float64)(1.0 / *ptr_00);
    **active_alpha = 1.0;
    **active_astate = 0;
    *n_active_astate = 1;
    *ptr_01 = 0;
    if (n_obs < 2) {
      iVar22 = 0;
    }
    else {
      uVar26 = 0;
      n_elem = 1;
      uVar27 = 1;
      sVar28 = 1;
      do {
        if (phseg == (s3phseg_t *)0x0) {
          local_e8 = (s3phseg_t *)0x0;
        }
        else {
          local_e8 = phseg;
          if (phseg->ef < uVar27) {
            local_e8 = phseg->next;
          }
        }
        uVar23 = (uint)n_elem;
        pfVar17 = (float64 *)
                  __ckd_calloc__(n_elem,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                 ,0x15d);
        active_alpha[uVar27] = pfVar17;
        if (bp != (uint32 **)0x0) {
          puVar18 = (uint32 *)
                    __ckd_calloc__(n_elem,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                   ,0x15f);
          bp[uVar27] = puVar18;
          if ((uint)sVar28 < uVar23) {
            local_100 = __ckd_realloc__(local_100,n_elem * 8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                        ,0x162);
          }
          memset(local_100,0,n_elem * 8);
        }
        sVar28 = n_elem;
        if (uVar23 == 0) {
          uVar24 = 0;
          uVar25 = 0;
        }
        else {
          sVar19 = 0;
          uVar25 = 0;
          uVar24 = 0;
          do {
            uVar6 = ptr_01[sVar19];
            if (state_seq[uVar6].n_next != 0) {
              puVar18 = state_seq[uVar6].next_state;
              uVar29 = 0;
              do {
                uVar7 = puVar18[uVar29];
                uVar30 = (ulong)uVar7;
                if ((state_seq[uVar30].mixw != 0xffffffff) &&
                   (*(short *)((long)__s + uVar30 * 2) == -1)) {
                  uVar8 = state_seq[uVar30].l_cb;
                  uVar31 = (ulong)uVar8;
                  if (uVar27 != *(uint *)((long)ptr + uVar31 * 4)) {
                    if (timers != (bw_timers_t *)0x0) {
                      ptmr_start(&timers->gau_timer);
                    }
                    prev_den_idx = (uint32 **)0x0;
                    if (uVar5 == 1) {
                      prev_den_idx = den_idx[uVar31];
                    }
                    gauden_compute_log(den[uVar31],den_idx[uVar31],feature[uVar27],g,
                                       state_seq[uVar30].cb,prev_den_idx);
                    uVar1 = uVar25 + 1;
                    cb[uVar25] = uVar8;
                    *(int *)((long)ptr + uVar31 * 4) = (int)uVar27;
                    uVar25 = uVar1;
                    if (timers != (bw_timers_t *)0x0) {
                      ptmr_stop(&timers->gau_timer);
                    }
                  }
                  *(short *)((long)__s + uVar30 * 2) = (short)uVar24;
                  pfVar17 = active_alpha[uVar27];
                  pfVar17[uVar24] = 0.0;
                  *(uint *)((long)ptr_02 + (ulong)uVar24 * 4) = uVar7;
                  uVar24 = uVar24 + 1;
                  if (uVar24 == (uint)sVar28) {
                    sVar28 = (size_t)((uint)sVar28 + 10);
                    pfVar17 = (float64 *)
                              __ckd_realloc__(pfVar17,sVar28 * 8,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                              ,0x1a4);
                    active_alpha[uVar27] = pfVar17;
                    if (bp != (uint32 **)0x0) {
                      puVar20 = (uint32 *)
                                __ckd_realloc__(bp[uVar27],sVar28 * 4,
                                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                                ,0x1a8);
                      bp[uVar27] = puVar20;
                      local_100 = __ckd_realloc__(local_100,sVar28 * 8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                                  ,0x1ab);
                      puVar11 = bp[uVar27];
                      puVar20 = puVar11 + (sVar28 - 10);
                      puVar20[0] = 0;
                      puVar20[1] = 0;
                      puVar20[2] = 0;
                      puVar20[3] = 0;
                      puVar20 = puVar11 + (sVar28 - 6);
                      puVar20[0] = 0;
                      puVar20[1] = 0;
                      puVar20[2] = 0;
                      puVar20[3] = 0;
                      (puVar11 + (sVar28 - 2))[0] = 0;
                      (puVar11 + (sVar28 - 2))[1] = 0;
                      puVar3 = (undefined8 *)((long)local_100 + sVar28 * 8 + -0x50);
                      *puVar3 = 0;
                      puVar3[1] = 0;
                      puVar3 = (undefined8 *)((long)local_100 + sVar28 * 8 + -0x40);
                      *puVar3 = 0;
                      puVar3[1] = 0;
                      puVar3 = (undefined8 *)((long)local_100 + sVar28 * 8 + -0x30);
                      *puVar3 = 0;
                      puVar3[1] = 0;
                      puVar3 = (undefined8 *)((long)local_100 + sVar28 * 8 + -0x20);
                      *puVar3 = 0;
                      puVar3[1] = 0;
                      puVar3 = (undefined8 *)((long)local_100 + sVar28 * 8 + -0x10);
                      *puVar3 = 0;
                      puVar3[1] = 0;
                    }
                  }
                }
                uVar29 = uVar29 + 1;
              } while (uVar29 < state_seq[uVar6].n_next);
            }
            sVar19 = sVar19 + 1;
          } while (sVar19 != n_elem);
        }
        pfVar17 = gauden_scale_densities_fwd(den,den_idx,cb,uVar25,g);
        dscale[uVar27] = pfVar17;
        if (uVar23 != 0) {
          sVar19 = 0;
          do {
            uVar23 = ptr_01[sVar19];
            if (state_seq[uVar23].n_next != 0) {
              puVar18 = state_seq[uVar23].next_state;
              pfVar10 = state_seq[uVar23].next_tprob;
              dVar35 = (double)active_alpha[uVar27 - 1][sVar19];
              uVar29 = 0;
              do {
                uVar30 = (ulong)puVar18[uVar29];
                if ((ulong)state_seq[uVar30].mixw != 0xffffffff) {
                  fVar12 = gauden_mixture(den[state_seq[uVar30].l_cb],
                                          den_idx[state_seq[uVar30].l_cb],
                                          pppfVar9[state_seq[uVar30].mixw],g);
                  ptr_00[uVar30] = (double)fVar12;
                  dVar13 = (double)(float)pfVar10[uVar29] * dVar35;
                  if ((bp != (uint32 **)0x0) &&
                     (uVar31 = (ulong)*(ushort *)((long)__s + uVar30 * 2),
                     pdVar2 = (double *)((long)local_100 + uVar31 * 8),
                     *pdVar2 <= dVar13 && dVar13 != *pdVar2)) {
                    *(double *)((long)local_100 + uVar31 * 8) = dVar13;
                    bp[uVar27][uVar31] = (uint32)sVar19;
                  }
                  uVar4 = *(ushort *)((long)__s + uVar30 * 2);
                  active_alpha[uVar27][uVar4] =
                       (float64)(dVar13 * ptr_00[uVar30] + (double)active_alpha[uVar27][uVar4]);
                }
                uVar29 = uVar29 + 1;
              } while (uVar29 < state_seq[uVar23].n_next);
            }
            sVar19 = sVar19 + 1;
          } while (sVar19 != n_elem);
        }
        if (uVar24 != 0) {
          uVar29 = 0;
          do {
            uVar23 = *(uint *)((long)ptr_02 + uVar29 * 4);
            if (state_seq[uVar23].n_next != 0) {
              puVar18 = state_seq[uVar23].next_state;
              pfVar10 = state_seq[uVar23].next_tprob;
              uVar30 = 0;
              do {
                uVar6 = puVar18[uVar30];
                uVar31 = (ulong)uVar6;
                if (state_seq[uVar31].mixw == 0xffffffff) {
                  pfVar17 = active_alpha[uVar27];
                  dVar35 = (double)(float)pfVar10[uVar30] * (double)pfVar17[uVar29];
                  if (*(short *)((long)__s + uVar31 * 2) == -1) {
                    *(short *)((long)__s + uVar31 * 2) = (short)uVar24;
                    pfVar17[uVar24] = 0.0;
                    *(uint *)((long)ptr_02 + (ulong)uVar24 * 4) = uVar6;
                    uVar24 = uVar24 + 1;
                    if (uVar24 == (uint)sVar28) {
                      sVar28 = (size_t)((uint)sVar28 + 10);
                      pfVar17 = (float64 *)
                                __ckd_realloc__(pfVar17,sVar28 * 8,
                                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                                ,0x21c);
                      active_alpha[uVar27] = pfVar17;
                      if (bp != (uint32 **)0x0) {
                        puVar20 = (uint32 *)
                                  __ckd_realloc__(bp[uVar27],sVar28 * 4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                                  ,0x21f);
                        bp[uVar27] = puVar20;
                        local_100 = __ckd_realloc__(local_100,sVar28 * 8,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                                  ,0x221);
                        puVar11 = bp[uVar27];
                        puVar20 = puVar11 + (sVar28 - 10);
                        puVar20[0] = 0;
                        puVar20[1] = 0;
                        puVar20[2] = 0;
                        puVar20[3] = 0;
                        puVar20 = puVar11 + (sVar28 - 6);
                        puVar20[0] = 0;
                        puVar20[1] = 0;
                        puVar20[2] = 0;
                        puVar20[3] = 0;
                        (puVar11 + (sVar28 - 2))[0] = 0;
                        (puVar11 + (sVar28 - 2))[1] = 0;
                        puVar3 = (undefined8 *)((long)local_100 + sVar28 * 8 + -0x50);
                        *puVar3 = 0;
                        puVar3[1] = 0;
                        puVar3 = (undefined8 *)((long)local_100 + sVar28 * 8 + -0x40);
                        *puVar3 = 0;
                        puVar3[1] = 0;
                        puVar3 = (undefined8 *)((long)local_100 + sVar28 * 8 + -0x30);
                        *puVar3 = 0;
                        puVar3[1] = 0;
                        puVar3 = (undefined8 *)((long)local_100 + sVar28 * 8 + -0x20);
                        *puVar3 = 0;
                        puVar3[1] = 0;
                        puVar3 = (undefined8 *)((long)local_100 + sVar28 * 8 + -0x10);
                        *puVar3 = 0;
                        puVar3[1] = 0;
                      }
                    }
                    if (bp != (uint32 **)0x0) {
                      uVar21 = (ulong)*(ushort *)((long)__s + uVar31 * 2);
                      bp[uVar27][uVar21] = (uint32)uVar29;
                      *(double *)((long)local_100 + uVar21 * 8) = dVar35;
                    }
                  }
                  if ((bp != (uint32 **)0x0) &&
                     (uVar21 = (ulong)*(ushort *)((long)__s + uVar31 * 2),
                     pdVar2 = (double *)((long)local_100 + uVar21 * 8),
                     *pdVar2 <= dVar35 && dVar35 != *pdVar2)) {
                    bp[uVar27][uVar21] = (uint32)uVar29;
                    *(double *)((long)local_100 + uVar21 * 8) = dVar35;
                  }
                  uVar4 = *(ushort *)((long)__s + uVar31 * 2);
                  active_alpha[uVar27][uVar4] =
                       (float64)(dVar35 + (double)active_alpha[uVar27][uVar4]);
                }
                uVar30 = uVar30 + 1;
              } while (uVar30 < state_seq[uVar23].n_next);
            }
            uVar29 = uVar29 + 1;
          } while (uVar29 < uVar24);
        }
        uVar29 = (ulong)uVar24;
        if (uVar24 == 0) {
          dVar35 = 0.0;
        }
        else {
          uVar33 = 0;
          uVar34 = 0;
          uVar30 = 0;
          do {
            dVar35 = (double)active_alpha[uVar27][uVar30];
            if (dVar35 <= (double)CONCAT44(uVar34,uVar33)) {
              dVar35 = (double)CONCAT44(uVar34,uVar33);
            }
            uVar30 = uVar30 + 1;
            uVar33 = SUB84(dVar35,0);
            uVar34 = (undefined4)((ulong)dVar35 >> 0x20);
          } while (uVar29 != uVar30);
        }
        if (((uVar29 != 0) && (dVar35 == 0.0)) && (!NAN(dVar35))) {
          forward_cold_1();
LAB_0010864a:
          iVar22 = -1;
          goto LAB_0010865e;
        }
        if (dVar35 < 1e-300) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                  ,0x263,"Best alpha < 1e-300\n");
          goto LAB_0010864a;
        }
        if (uVar29 == 0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                  ,0x26a,"No active states at time %u\n");
          goto LAB_0010864a;
        }
        scale[uVar27] = (float64)(1.0 / dVar35);
        dVar13 = log10(dVar35);
        dVar14 = log10((double)beam);
        if (local_e8 == (s3phseg_t *)0x0) {
          bVar32 = false;
        }
        else {
          uVar30 = 0;
          do {
            aVar15 = acmod_set_base_phone
                               (acmod_set,state_seq[*(uint *)((long)ptr_02 + uVar30 * 4)].phn);
            aVar16 = acmod_set_base_phone(acmod_set,local_e8->phone);
            uVar31 = uVar30;
            if (aVar15 == aVar16) break;
            uVar30 = uVar30 + 1;
            uVar31 = uVar29;
          } while (uVar29 != uVar30);
          bVar32 = (uint)uVar31 != uVar24;
        }
        uVar30 = -(ulong)(-300.0 < dVar13 + dVar14);
        puVar18 = (uint32 *)
                  __ckd_calloc__(uVar29,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                 ,0x293);
        active_astate[uVar27] = puVar18;
        uVar29 = 1;
        if (1 < uVar24) {
          uVar29 = (ulong)uVar24;
        }
        uVar31 = 0;
        n_elem = 0;
        do {
          if ((bp != (uint32 **)0x0) &&
             (state_seq[*(uint *)((long)ptr_02 + uVar31 * 4)].mixw == 0xffffffff)) {
            bp[uVar27][uVar31] = *(uint32 *)((long)ptr_02 + (ulong)bp[uVar27][uVar31] * 4);
          }
          if ((bool)(local_e8 != (s3phseg_t *)0x0 & bVar32)) {
            aVar15 = acmod_set_base_phone
                               (acmod_set,state_seq[*(uint *)((long)ptr_02 + uVar31 * 4)].phn);
            aVar16 = acmod_set_base_phone(acmod_set,local_e8->phone);
            if (aVar15 == aVar16) {
              active_alpha[uVar27][n_elem] =
                   (float64)((double)active_alpha[uVar27][uVar31] * (double)scale[uVar27]);
              uVar25 = *(uint32 *)((long)ptr_02 + uVar31 * 4);
              active_astate[uVar27][n_elem] = uVar25;
              ptr_01[n_elem] = uVar25;
              if (bp != (uint32 **)0x0) {
                bp[uVar27][n_elem] = bp[uVar27][uVar31];
              }
              *(short *)((long)__s + (ulong)*(uint *)((long)ptr_02 + uVar31 * 4) * 2) =
                   (short)n_elem;
              n_elem = (size_t)((int)n_elem + 1);
            }
            else {
              *(undefined2 *)((long)__s + (ulong)*(uint *)((long)ptr_02 + uVar31 * 4) * 2) = 0xffff;
            }
          }
          else {
            dVar13 = (double)active_alpha[uVar27][uVar31];
            if (dVar13 <= (double)(~uVar30 & 0x1a56e1fc2f8f359 |
                                  (ulong)(dVar35 * (double)beam) & uVar30)) {
              *(undefined2 *)((long)__s + (ulong)*(uint *)((long)ptr_02 + uVar31 * 4) * 2) = 0xffff;
            }
            else {
              active_alpha[uVar27][n_elem] = (float64)(dVar13 * (double)scale[uVar27]);
              uVar25 = *(uint32 *)((long)ptr_02 + uVar31 * 4);
              active_astate[uVar27][n_elem] = uVar25;
              ptr_01[n_elem] = uVar25;
              if (bp != (uint32 **)0x0) {
                bp[uVar27][n_elem] = bp[uVar27][uVar31];
              }
              *(short *)((long)__s + (ulong)*(uint *)((long)ptr_02 + uVar31 * 4) * 2) =
                   (short)n_elem;
              n_elem = (size_t)((int)n_elem + 1);
            }
          }
          uVar31 = uVar31 + 1;
        } while (uVar29 != uVar31);
        uVar25 = (uint32)n_elem;
        if (uVar25 != 0) {
          sVar19 = 0;
          do {
            if ((bp != (uint32 **)0x0) && (state_seq[(uint)ptr_01[sVar19]].mixw == 0xffffffff)) {
              bp[uVar27][sVar19] = (uint)*(ushort *)((long)__s + (ulong)bp[uVar27][sVar19] * 2);
            }
            sVar19 = sVar19 + 1;
          } while (n_elem != sVar19);
          sVar19 = 0;
          do {
            *(undefined2 *)((long)__s + (ulong)(uint)ptr_01[sVar19] * 2) = 0xffff;
            sVar19 = sVar19 + 1;
          } while (n_elem != sVar19);
        }
        n_active_astate[uVar27] = uVar25;
        uVar26 = uVar26 + uVar25;
        uVar27 = uVar27 + 1;
        phseg = local_e8;
      } while (uVar27 != n_obs);
      iVar22 = 0;
    }
LAB_0010865e:
    if (mmi_train == 0) {
      printf(" %u ",(ulong)uVar26 / (ulong)n_obs,(ulong)uVar26 % (ulong)n_obs);
    }
  }
  ckd_free(ptr_01);
  ckd_free(ptr_02);
  ckd_free(__s);
  ckd_free(cb);
  ckd_free(ptr);
  ckd_free(ptr_00);
  ckd_free(local_100);
  ckd_free_3d(den);
  ckd_free_3d(den_idx);
  return iVar22;
}

Assistant:

int32
forward(float64 **active_alpha,
	uint32 **active_astate,
	uint32 *n_active_astate,
	uint32 **bp,
	float64 *scale,
	float64 **dscale,
	vector_t **feature,
	uint32 n_obs,
	state_t *state_seq,
	uint32 n_state,
	model_inventory_t *inv,
	float64 beam,
	s3phseg_t *phseg,
	bw_timers_t *timers,
	uint32 mmi_train)
{
    uint32 i, j, s, t, u;
    uint32 l_cb;
    uint32 *active_a;
    uint32 *active_b;
    uint32 *active;
    uint32 *active_l_cb;
    uint32 n_active;
    uint32 n_active_l_cb;
    uint32 n_sum_active;
    uint32 *next_active;
    uint32 n_next_active;
    uint32 aalpha_alloc;
    uint16 *amap;
    uint32 *next;
    float32 *tprob;
    float64 prior_alpha;
    float32 ***mixw;
    gauden_t *g;
    acmod_set_t *as;
    float64 x;
    float64 pthresh = 1e-300;
    float64 balpha;
    float64 ***now_den;
    uint32 ***now_den_idx;
    uint32 retval = S3_SUCCESS;
    uint32 n_l_cb;
    int32 *acbframe; /* Frame in which a codebook was last active */
    float64 *outprob;
    /* Can we prune this frame using phseg? */
    int can_prune_phseg;
    float64 *best_pred = NULL;
    
    /* # of distinct codebooks referenced by this utterance */
    n_l_cb = inv->n_cb_inverse;

    /* active codebook frame index */
    acbframe = ckd_calloc(n_l_cb, sizeof(*acbframe));

    g = inv->gauden;
    as = inv->mdef->acmod_set;
    /* density values and indices (for top-N eval) for some time t */
    now_den = (float64 ***)ckd_calloc_3d(n_l_cb, gauden_n_feat(g), gauden_n_top(g),
					 sizeof(float64));
    now_den_idx = (uint32 ***)ckd_calloc_3d(n_l_cb, gauden_n_feat(g), gauden_n_top(g),
					    sizeof(uint32));
    /* Mixing weight array */
    mixw = inv->mixw;

    /* Scratch area for output probabilities at some time t */
    outprob = (float64 *)ckd_calloc(n_state, sizeof(float64));

    /* Active state lists for time t and t+1 */
    active_a = ckd_calloc(n_state, sizeof(uint32));
    active_b = ckd_calloc(n_state, sizeof(uint32));

    /* Active (local) codebooks for some time t */
    active_l_cb = ckd_calloc(n_state, sizeof(uint32));

    /* Mapping from sentence HMM state index to active state list index
    * for currently active time. */
    amap = ckd_calloc(n_state, sizeof(uint16));
    
    /* set up the active and next_active lists and associated counts */
    active = active_a;
    next_active = active_b;
    n_active = 0;
    n_active_l_cb = 0;
    n_sum_active = 0;
    n_next_active = 0;

    /* Initialize the active state map such that all states are inactive */
    for (i = 0; i < n_state; i++)
	amap[i] = INACTIVE;

    /*
     * The following section computes the output liklihood of
     * the initial state for t == 0 and puts the initial state
     * in the active state list.
     */

    if (timers)
	ptmr_start(&timers->gau_timer);

    /* compute alpha for the initial state at t == 0 */
    /* Compute the component Gaussians for state 0 mixture density */
    gauden_compute_log(now_den[state_seq[0].l_cb],
		       now_den_idx[state_seq[0].l_cb],
		       feature[0],
		       g,
		       state_seq[0].cb, NULL);

    active_l_cb[0] = state_seq[0].l_cb;

    dscale[0] = gauden_scale_densities_fwd(now_den, now_den_idx,
					   active_l_cb, 1, g);

    /* Compute the mixture density value for state 0 time 0 */
    outprob[0] = gauden_mixture(now_den[state_seq[0].l_cb],
				now_den_idx[state_seq[0].l_cb],
				mixw[state_seq[0].mixw],
				g);
    if (timers)
	ptmr_stop(&timers->gau_timer);
    if (outprob[0] <= MIN_IEEE_NORM_POS_FLOAT32) {
	E_ERROR("Small output prob (== %.2e) seen at frame 0 state 0\n", outprob[0]);

	retval = S3_ERROR;
	
	goto cleanup;
    }

    /*
     * Allocate space for the initial state in the alpha
     * and active state arrays
     */
    active_alpha[0] = ckd_calloc(1, sizeof(float64));
    active_astate[0] = ckd_calloc(1, sizeof(uint32));
    if (bp)
	bp[0] = ckd_calloc(1, sizeof(uint32)); /* Unused, actually */
    aalpha_alloc = 1;

    /*
     * Allocate the bestscore array for embedded Viterbi
     */
    if (bp)
	best_pred = ckd_calloc(1, sizeof(float64));

    /* Compute scale for t == 0 */
    scale[0] = 1.0 / outprob[0];

    /* set the scaled alpha variable for the initial state */
    active_alpha[0][0] = 1.0;
    /* put the initial state in the active state array for t == 0 */
    active_astate[0][0] = 0;
    /* Only one initial state (for now) */
    n_active_astate[0] = 1;

    /* insert the initial state in the active list */
    active[n_active] = 0;
    n_active++;

    /* Compute scaled alpha over all remaining time in the utterance */
    for (t = 1; t < n_obs; t++) {
	/* Find active phone for this timepoint. */
	if (phseg) {
	    /* Move the pointer forward if necessary. */
	    if (t > phseg->ef)
		phseg = phseg->next;
	}
	n_active_l_cb = 0;

	/* assume next active state set about the same size as current;
	   adjust to actual size as necessary later */
	active_alpha[t] = (float64 *)ckd_calloc(n_active, sizeof(float64));
	if (bp) {
	    bp[t] = (uint32 *)ckd_calloc(n_active, sizeof(uint32));
	    /* reallocate the best score array and zero it out */
	    if (n_active > aalpha_alloc)
		best_pred = (float64 *)ckd_realloc(best_pred, n_active * sizeof(float64));
	    memset(best_pred, 0, n_active * sizeof(float64));
	}
	aalpha_alloc = n_active;

	/* For all active states at the previous frame, activate their
	   successors in this frame and compute codebooks. */
	/* (these are pre-computed so they can be scaled to avoid underflows) */
	for (s = 0; s < n_active; s++) {
	    i = active[s];
#if FORWARD_DEBUG
	    E_INFO("At time %d, In Gaussian computation, active state %d\n",t, i);
#endif
	    /* get list of states adjacent to active state i */
	    next = state_seq[i].next_state;	

	    /* activate them all, computing their codebook densities if necessary */
	    for (u = 0; u < state_seq[i].n_next; u++) {
		j = next[u];
#if FORWARD_DEBUG
		E_INFO("In Gaussian computation, active state %d, next state %d\n", i,j);
#endif
		if (state_seq[j].mixw != TYING_NON_EMITTING) {
		    if (amap[j] == INACTIVE) {
			l_cb = state_seq[j].l_cb;
			
			if (acbframe[l_cb] != t) {
			    /* Component density values not yet computed */
			    if (timers)
				ptmr_start(&timers->gau_timer);
			    gauden_compute_log(now_den[l_cb],
					       now_den_idx[l_cb],
					       feature[t],
					       g,
					       state_seq[j].cb,
					       /* Preinitializing topn
						  only really makes a
						  difference for
						  semi-continuous
						  (n_l_cb == 1)
						  models. */
					       n_l_cb == 1
					       ? now_den_idx[l_cb] : NULL);

			    active_l_cb[n_active_l_cb++] = l_cb;
			    acbframe[l_cb] = t;

			    if (timers)
				ptmr_stop(&timers->gau_timer);
			}

			/* Put next state j into the active list */
			amap[j] = n_next_active;

			/* Initialize the alpha variable to zero */
			active_alpha[t][n_next_active] = 0;

			/* Map active state list index to sentence HMM index */
			next_active[n_next_active] = j;

			++n_next_active;

			if (n_next_active == aalpha_alloc) {
			    /* Need to reallocate the active_alpha array */
			    aalpha_alloc += ACHK;
			    active_alpha[t] = ckd_realloc(active_alpha[t],
							  sizeof(float64) * aalpha_alloc);
			    /* And the backpointer array */
			    if (bp) {
				bp[t] = ckd_realloc(bp[t],
						    sizeof(uint32) * aalpha_alloc);
				/* And the best score array */
				best_pred = (float64 *)ckd_realloc(best_pred,
								   sizeof(float64) * aalpha_alloc);
				/* Make sure the new stuff is zero */
				memset(bp[t] + aalpha_alloc - ACHK,
				       0, sizeof(uint32) * ACHK);
				memset(best_pred + aalpha_alloc - ACHK,
				       0, sizeof(float64) * ACHK);
			    }
			}
		    }
		}
	    }
	}

	/* Cope w/ numerical issues by dividing densities by max density */
	dscale[t] = gauden_scale_densities_fwd(now_den, now_den_idx,
					       active_l_cb, n_active_l_cb, g);
	
	/* Now, for all active states in the previous frame, compute
	   alpha for all successors in this frame. */
	for (s = 0; s < n_active; s++) {
	    i = active[s];
	    
#if FORWARD_DEBUG
	    E_INFO("At time %d, In real state alpha update, active state %d\n",t, i);
#endif
	    /* get list of states adjacent to active state i */
	    next = state_seq[i].next_state;	
	    /* get the associated transition probs */
	    tprob = state_seq[i].next_tprob;

	    /* the scaled alpha value for i at t-1 */
	    prior_alpha = active_alpha[t-1][s];

	    /* For all emitting states j adjacent to i, update their
	     * alpha values.  */
	    for (u = 0; u < state_seq[i].n_next; u++) {
		j = next[u];
#if FORWARD_DEBUG
		E_INFO("In real state update, active state %d, next state %d\n", i,j);
#endif
		l_cb = state_seq[j].l_cb;

		if (state_seq[j].mixw != TYING_NON_EMITTING) {
		    /* Next state j is an emitting state */
		    outprob[j] = gauden_mixture(now_den[l_cb],
						now_den_idx[l_cb],
						mixw[state_seq[j].mixw],
						g);


		    /* update backpointers bp[t][j] */
		    x = prior_alpha * tprob[u];
		    if (bp) {
			if (x > best_pred[amap[j]]) {
#if FORWARD_DEBUG
			    E_INFO("In real state update, backpointer %d => %d updated from %e to (%e * %e = %e)\n",
				   i, j, best_pred[amap[j]], prior_alpha, tprob[u], x);
#endif
			    best_pred[amap[j]] = x;
			    bp[t][amap[j]] = s;
			}
		    }
		    
		    /* update the unscaled alpha[t][j] */
		    active_alpha[t][amap[j]] += x * outprob[j];
		}
		else {
		    /* already done below in the prior time frame */
		}
	    }
	}

#if FORWARD_DEBUG
	if (bp) {
	    for (s = 0; s < n_next_active; ++s) {
		j = next_active[s];
		E_INFO("After real state update, best path to %d(%d) = %d(%d)\n",
		       j, amap[j], active[bp[t][s]], bp[t][s]);
	    }
	}
#endif
	/* Now, for all active states in this frame, consume any
	   following non-emitting states (multiplying in their
	   transition probabilities)  */
	for (s = 0; s < n_next_active; s++) {
	    i = next_active[s];

	    /* find the successor states */
	    next = state_seq[i].next_state;
	    tprob = state_seq[i].next_tprob;

	    for (u = 0; u < state_seq[i].n_next; u++) {
		j = next[u];
		/* for any non-emitting ones */
		if (state_seq[j].mixw == TYING_NON_EMITTING) {
#if FORWARD_DEBUG
		    E_INFO("In non-emitting state update, active state %d, next state %d\n",i,j);
#endif
		    x = active_alpha[t][s] * tprob[u];

#if FORWARD_DEBUG
		    E_INFO("In non-emitting state update, active_alpha[t][s]: %f,tprob[u]:  %f\n",active_alpha[t][s],tprob[u]);
#endif
		    /* activate this state if necessary */
		    if (amap[j] == INACTIVE) {
			amap[j] = n_next_active;
			active_alpha[t][n_next_active] = 0;
			next_active[n_next_active] = j;
			++n_next_active;

			if (n_next_active == aalpha_alloc) {
			    aalpha_alloc += ACHK;
			    active_alpha[t] = ckd_realloc(active_alpha[t],
							  sizeof(float64) * aalpha_alloc);
			    if (bp) {
				bp[t] = ckd_realloc(bp[t],
						    sizeof(uint32) * aalpha_alloc);
				best_pred = (float64 *)ckd_realloc(best_pred,
								   sizeof(float64) * aalpha_alloc);
				memset(bp[t] + aalpha_alloc - ACHK,
				       0, sizeof(uint32) * ACHK);
				memset(best_pred + aalpha_alloc - ACHK,
				       0, sizeof(float64) * ACHK);
			    }
			}
			if (bp) {
			    /* Give its backpointer a default value */
			    bp[t][amap[j]] = s;
			    best_pred[amap[j]] = x;
			}
		    }

		    /* update backpointers bp[t][j] */
		    if (bp && x > best_pred[amap[j]]) {
			bp[t][amap[j]] = s;
			best_pred[amap[j]] = x;
		    }
		    /* update its alpha value */
		    active_alpha[t][amap[j]] += x;
		}
	    }
	}

#if FORWARD_DEBUG
	for (s = 0; s < n_next_active; ++s) {
	    j = next_active[s];
	    if (bp && state_seq[j].mixw == TYING_NON_EMITTING) {
		E_INFO("After non-emitting state update, best path to %d(%d) = %d(%d)\n",
		       j, amap[j], next_active[bp[t][s]], bp[t][s]);
		/* Assumptions about topology that might not be valid
		 * but are useful for debugging. */
		assert(next_active[bp[t][s]] <= j);
		assert(j - next_active[bp[t][s]] <= 2);
	    }
	}
#endif
	/* find best alpha value in current frame for pruning and scaling purposes */
	balpha = 0;
	/* also take the argmax to find the best backtrace */
	for (s = 0; s < n_next_active; s++) {
	    if (balpha < active_alpha[t][s]) {
		balpha = active_alpha[t][s];
	    }
	}

	/* cope with some pathological case */
	if (balpha == 0.0 && n_next_active > 0) {
	    E_ERROR("All %u active states,", n_next_active);
	    for (s = 0; s < n_next_active; s++) {
		if (state_seq[next_active[s]].mixw != TYING_NON_EMITTING)
		    fprintf(stderr, " %u", state_seq[next_active[s]].mixw);
		else
		    fprintf(stderr, " N(%u,%u)",
			    state_seq[next_active[s]].tmat, state_seq[next_active[s]].m_state);

	    }
	    fprintf(stderr, ", zero at time %u\n", t);
	    fflush(stderr);
	    retval =  S3_ERROR;
	    break;
	}

	/* and some related pathological cases */
	if (balpha < 1e-300) {
	    E_ERROR("Best alpha < 1e-300\n");

	    retval = S3_ERROR;

	    break;
	}
	if (n_next_active == 0) {
	    E_ERROR("No active states at time %u\n", t);
	    retval = S3_ERROR;
	    break;
	}

	/* compute the scale factor */
	scale[t] = 1.0 / balpha;
	/* compute the pruning threshold based on the beam */
	if (log10(balpha) + log10(beam) > -300) {
	    pthresh = balpha * beam;
	}
	else {
	    /* avoiding underflow... */
	    pthresh = 1e-300;
	}
/* DEBUG XXXXX */
/* pthresh = 0.0; */
/* END DEBUG */

	/* Determine if phone segmentation-based pruning would leave
	 * us with an empty active list (that would be bad!) */
	can_prune_phseg = 0;
	if (phseg) {
	    for (s = 0; s < n_next_active; ++s) 
		if (acmod_set_base_phone(as, state_seq[next_active[s]].phn)
		    == acmod_set_base_phone(as, phseg->phone))
		    break;
	    can_prune_phseg = !(s == n_next_active);
#if FORWARD_DEBUG
	    if (!can_prune_phseg) {
		E_INFO("Will not apply phone-based pruning at timepoint %d "
		       "(%d != %d) (%s != %s)\n", t,
		       state_seq[next_active[s]].phn,
		       phseg->phone,
		       acmod_set_id2name(inv->mdef->acmod_set, state_seq[next_active[s]].phn),
		       acmod_set_id2name(inv->mdef->acmod_set, phseg->phone)
		       );
	    }
#endif
	}
	/* Prune active states for the next frame and rescale their alphas. */
	active_astate[t] = ckd_calloc(n_next_active, sizeof(uint32));
	for (s = 0, n_active = 0; s < n_next_active; s++) {
	    /* "Snap" the backpointers for non-emitting states, so
	       that they don't point to bogus indices (we will use
	       amap to recover them). */
	    if (bp && state_seq[next_active[s]].mixw == TYING_NON_EMITTING) {
#if FORWARD_DEBUG
		E_INFO("Snapping backpointer for %d, %d => %d\n",
		       next_active[s], bp[t][s], next_active[bp[t][s]]);
#endif
		bp[t][s] = next_active[bp[t][s]];
	    }
	    /* If we have a phone segmentation, use it instead of the beam. */
	    if (phseg && can_prune_phseg) {
		if (acmod_set_base_phone(as, state_seq[next_active[s]].phn)
		    == acmod_set_base_phone(as, phseg->phone)) {
		    active_alpha[t][n_active] = active_alpha[t][s] * scale[t];
		    active[n_active] = active_astate[t][n_active] = next_active[s];
		    if (bp)
			bp[t][n_active] = bp[t][s];
		    amap[next_active[s]] = n_active;
		    n_active++;
		}
		else {
		    amap[next_active[s]] = INACTIVE;
		}
	    }
	    else {
		if (active_alpha[t][s] > pthresh) {
		    active_alpha[t][n_active] = active_alpha[t][s] * scale[t];
		    active[n_active] = active_astate[t][n_active] = next_active[s];
		    if (bp)
			bp[t][n_active] = bp[t][s];
		    amap[next_active[s]] = n_active;
		    n_active++;
		}
		else {
		    amap[next_active[s]] = INACTIVE;
		}
	    }
	}
	/* Now recover the backpointers for non-emitting states. */
	for (s = 0; s < n_active; ++s) {
	    if (bp && state_seq[active[s]].mixw == TYING_NON_EMITTING) {
#if FORWARD_DEBUG
		E_INFO("Snapping backpointer for %d, %d => %d(%d)\n",
		       active[s], bp[t][s], amap[bp[t][s]], active[amap[bp[t][s]]]);
#endif
		bp[t][s] = amap[bp[t][s]];
	    }
	}
	/* And finally deactive all states. */
	for (s = 0; s < n_active; ++s) {
	    amap[active[s]] = INACTIVE;
	}
	n_active_astate[t] = n_active;
	n_next_active = 0;

	n_sum_active += n_active;
    }
    if (!mmi_train)
	printf(" %u ", n_sum_active / n_obs);
    
cleanup:
    ckd_free(active_a);
    ckd_free(active_b);
    ckd_free(amap);

    ckd_free(active_l_cb);
    ckd_free(acbframe);

    ckd_free(outprob);
    ckd_free(best_pred);

    ckd_free_3d((void ***)now_den);
    ckd_free_3d((void ***)now_den_idx);

    return retval;
}